

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O1

uint32_t getIpv4(string *addr)

{
  uint uVar1;
  int iVar2;
  runtime_error *this;
  addrinfo *res;
  addrinfo *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = getaddrinfo((addr->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)&addrinfo,&local_40);
  if (iVar2 == 0) {
    uVar1 = *(uint *)(local_40->ai_addr->sa_data + 2);
    freeaddrinfo(local_40);
    return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"Invalid IPv4 address or unknown hostname: ",addr);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t getIpv4(const std::string& addr)
{
    struct addrinfo* res;

    InitSocketLibrary();
    const auto status = getaddrinfo(addr.c_str(), nullptr, &addrinfo, &res);
    if (status) {
        throw std::runtime_error("Invalid IPv4 address or unknown hostname: " + addr);
    }

    const auto value = ((struct sockaddr_in*)res->ai_addr)->sin_addr.s_addr;
    freeaddrinfo(res);
    WSACleanup();
    return ntohl(value);
}